

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O2

void __thiscall Pl_StdioFile::Pl_StdioFile(Pl_StdioFile *this,char *identifier,FILE *f)

{
  Pipeline::Pipeline(&this->super_Pipeline,identifier,(Pipeline *)0x0);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_StdioFile_002ae7e0;
  std::make_unique<Pl_StdioFile::Members,_IO_FILE*&>((_IO_FILE **)&this->m);
  return;
}

Assistant:

Pl_StdioFile::Pl_StdioFile(char const* identifier, FILE* f) :
    Pipeline(identifier, nullptr),
    m(std::make_unique<Members>(f))
{
}